

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
* __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
::consume_operation::complete_type(consume_operation *this)

{
  uintptr_t uint_pointer;
  ControlBlock *pCVar1;
  
  pCVar1 = this->m_control;
  if (pCVar1 == (ControlBlock *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x3ee);
    pCVar1 = this->m_control;
  }
  return (FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          *)(pCVar1 + 1);
}

Assistant:

bool empty() const noexcept { return m_control == nullptr; }